

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionShape.cpp
# Opt level: O3

btScalar __thiscall btCollisionShape::getAngularMotionDisc(btCollisionShape *this)

{
  btVector3 center;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  
  (*this->_vptr_btCollisionShape[3])(this,&local_20,&local_24);
  return SQRT(local_18 * local_18 + local_20 * local_20 + local_1c * local_1c) + local_24;
}

Assistant:

btScalar	btCollisionShape::getAngularMotionDisc() const
{
	///@todo cache this value, to improve performance
	btVector3	center;
	btScalar disc;
	getBoundingSphere(center,disc);
	disc += (center).length();
	return disc;
}